

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

int __thiscall
absl::Cord::CompareSlowPath(Cord *this,string_view rhs,size_t compared_size,size_t size_to_compare)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  byte local_101;
  undefined1 auStack_e8 [4];
  int comparison_result;
  string_view lhs_chunk;
  ChunkIterator lhs_it;
  size_t sStack_38;
  anon_class_1_0_00000001 advance;
  size_t size_to_compare_local;
  size_t compared_size_local;
  Cord *this_local;
  string_view rhs_local;
  
  rhs_local._M_len = (size_t)rhs._M_str;
  this_local = (Cord *)rhs._M_len;
  sStack_38 = size_to_compare;
  chunk_begin((ChunkIterator *)&lhs_chunk._M_str,this);
  if (lhs_it.current_leaf_ == (CordRep *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8);
  }
  else {
    _auStack_e8 = ChunkIterator::operator*((ChunkIterator *)&lhs_chunk._M_str);
  }
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8);
  if (sVar4 < compared_size) {
    __assert_fail("compared_size <= lhs_chunk.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/cord.cc"
                  ,0x38e,"int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const")
    ;
  }
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar4 < compared_size) {
    __assert_fail("compared_size <= rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/cord.cc"
                  ,0x38f,"int absl::Cord::CompareSlowPath(absl::string_view, size_t, size_t) const")
    ;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8,compared_size);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,compared_size);
  sStack_38 = sStack_38 - compared_size;
  do {
    bVar1 = CompareSlowPath::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       ((long)lhs_it.btree_reader_.navigator_.node_ + 0x5f),
                       (ChunkIterator *)&lhs_chunk._M_str,(string_view *)auStack_e8);
    local_101 = 0;
    if (bVar1) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      local_101 = bVar1 ^ 0xff;
    }
    if ((local_101 & 1) == 0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8);
      return (uint)bVar1 - (uint)bVar2;
    }
    iVar3 = anon_unknown_37::CompareChunks
                      ((string_view *)auStack_e8,(string_view *)&this_local,&stack0xffffffffffffffc8
                      );
    if (iVar3 != 0) {
      return iVar3;
    }
  } while (sStack_38 != 0);
  return 0;
}

Assistant:

inline int Cord::CompareSlowPath(absl::string_view rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](Cord::ChunkIterator* absl_nonnull it,
                    absl::string_view* absl_nonnull chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();

  // compared_size is inside first chunk.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && !rhs.empty()) {
    int comparison_result = CompareChunks(&lhs_chunk, &rhs, &size_to_compare);
    if (comparison_result != 0) return comparison_result;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs.empty()) - static_cast<int>(lhs_chunk.empty());
}